

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ClearStatTables(Parse *pParse,int iDb,char *zType,char *zName)

{
  char *zDatabase;
  Table *pTVar1;
  uint uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  char local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  zDatabase = pParse->db->aDb[iDb].zDbSName;
  uVar3 = 1;
  do {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58[0] = -0x56;
    local_58[1] = -0x56;
    local_58[2] = -0x56;
    local_58[3] = -0x56;
    local_58[4] = -0x56;
    local_58[5] = -0x56;
    local_58[6] = -0x56;
    local_58[7] = -0x56;
    local_58[8] = -0x56;
    local_58[9] = -0x56;
    local_58[10] = -0x56;
    local_58[0xb] = -0x56;
    local_58[0xc] = -0x56;
    local_58[0xd] = -0x56;
    local_58[0xe] = -0x56;
    local_58[0xf] = -0x56;
    sqlite3_snprintf(0x18,local_58,"sqlite_stat%d",uVar3);
    pTVar1 = sqlite3FindTable(pParse->db,local_58,zDatabase);
    if (pTVar1 != (Table *)0x0) {
      sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE %s=%Q",zDatabase,local_58,zType,zName);
    }
    uVar2 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar2;
  } while (uVar2 != 5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sqlite3ClearStatTables(
  Parse *pParse,         /* The parsing context */
  int iDb,               /* The database number */
  const char *zType,     /* "idx" or "tbl" */
  const char *zName      /* Name of index or table */
){
  int i;
  const char *zDbName = pParse->db->aDb[iDb].zDbSName;
  for(i=1; i<=4; i++){
    char zTab[24];
    sqlite3_snprintf(sizeof(zTab),zTab,"sqlite_stat%d",i);
    if( sqlite3FindTable(pParse->db, zTab, zDbName) ){
      sqlite3NestedParse(pParse,
        "DELETE FROM %Q.%s WHERE %s=%Q",
        zDbName, zTab, zType, zName
      );
    }
  }
}